

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O2

int SSL_renegotiate(SSL *s)

{
  code *pcVar1;
  _func_3149 *p_Var2;
  __uniq_ptr_impl<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter> __p;
  bool bVar3;
  int iVar4;
  tuple<bssl::SSL_HANDSHAKE_*,_bssl::internal::Deleter> in_RAX;
  int line;
  __uniq_ptr_impl<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter> local_18;
  
  if (((byte)s->handshake_func[0xdd] & 8) == 0) {
    iVar4 = 0x42;
    line = 0x65d;
  }
  else {
    local_18._M_t.super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_bssl::SSL_HANDSHAKE_*,_false>._M_head_impl =
         (tuple<bssl::SSL_HANDSHAKE_*,_bssl::internal::Deleter>)
         (tuple<bssl::SSL_HANDSHAKE_*,_bssl::internal::Deleter>)
         in_RAX.super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_bssl::SSL_HANDSHAKE_*,_false>._M_head_impl;
    bVar3 = bssl::ssl_can_renegotiate((SSL *)s);
    if (bVar3) {
      iVar4 = SSL_can_release_private_key((SSL *)s);
      if (iVar4 != 0) {
        __assert_fail("!SSL_can_release_private_key(ssl)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_lib.cc"
                      ,0x667,"int SSL_renegotiate(SSL *)");
      }
      p_Var2 = s->handshake_func;
      if ((*(short *)(p_Var2 + 0x72) == 0) && (*(int *)(p_Var2 + 0xb0) == 0)) {
        if (*(long *)(p_Var2 + 0x118) == 0) {
          bssl::ssl_handshake_new((bssl *)&local_18,(SSL *)s);
          __p._M_t.super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_bssl::SSL_HANDSHAKE_*,_false>._M_head_impl =
               local_18._M_t.super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_bssl::SSL_HANDSHAKE_*,_false>._M_head_impl;
          local_18._M_t.super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_bssl::SSL_HANDSHAKE_*,_false>._M_head_impl =
               (tuple<bssl::SSL_HANDSHAKE_*,_bssl::internal::Deleter>)
               (_Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_*,_bssl::internal::Deleter>)0x0;
          std::__uniq_ptr_impl<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>::reset
                    ((__uniq_ptr_impl<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter> *)
                     (s->handshake_func + 0x118),
                     (pointer)__p._M_t.
                              super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_*,_bssl::internal::Deleter>
                              .super__Head_base<0UL,_bssl::SSL_HANDSHAKE_*,_false>._M_head_impl);
          std::unique_ptr<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter> *)&local_18);
          if (*(long *)(s->handshake_func + 0x118) != 0) {
            pcVar1 = s->handshake_func + 0xdd;
            *pcVar1 = (code)((byte)*pcVar1 & 0xf7);
            *(int *)(s->handshake_func + 0xc0) = *(int *)(s->handshake_func + 0xc0) + 1;
            return 1;
          }
          return 0;
        }
        iVar4 = 0x44;
        line = 0x675;
      }
      else {
        iVar4 = 0xb6;
        line = 0x66f;
      }
    }
    else {
      iVar4 = 0xb6;
      line = 0x662;
    }
  }
  ERR_put_error(0x10,0,iVar4,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_lib.cc"
                ,line);
  return 0;
}

Assistant:

int SSL_renegotiate(SSL *ssl) {
  // Caller-initiated renegotiation is not supported.
  if (!ssl->s3->renegotiate_pending) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_SHOULD_NOT_HAVE_BEEN_CALLED);
    return 0;
  }

  if (!ssl_can_renegotiate(ssl)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_NO_RENEGOTIATION);
    return 0;
  }

  // We should not have told the caller to release the private key.
  assert(!SSL_can_release_private_key(ssl));

  // Renegotiation is only supported at quiescent points in the application
  // protocol, namely in HTTPS, just before reading the HTTP response.
  // Require the record-layer be idle and avoid complexities of sending a
  // handshake record while an application_data record is being written.
  if (!ssl->s3->write_buffer.empty() ||
      ssl->s3->write_shutdown != ssl_shutdown_none) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_NO_RENEGOTIATION);
    return 0;
  }

  // Begin a new handshake.
  if (ssl->s3->hs != nullptr) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return 0;
  }
  ssl->s3->hs = ssl_handshake_new(ssl);
  if (ssl->s3->hs == nullptr) {
    return 0;
  }

  ssl->s3->renegotiate_pending = false;
  ssl->s3->total_renegotiations++;
  return 1;
}